

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void google::protobuf::DynamicMessageFactory::ConstructDefaultOneofInstance
               (Descriptor *type,uint32 *offsets,void *default_oneof_or_weak_instance)

{
  FieldDescriptor *this;
  CppType CVar1;
  undefined4 uVar2;
  char *pcVar3;
  EnumValueDescriptor *pEVar4;
  undefined8 uVar5;
  long lVar6;
  int __c;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong uVar7;
  int j;
  long lVar8;
  uint32 *__s;
  
  __c = (int)default_oneof_or_weak_instance;
  lVar6 = 0;
  __s = offsets;
  do {
    if (*(int *)(type + 0x38) <= lVar6) {
      return;
    }
    for (lVar8 = 0; lVar8 < *(int *)(*(long *)(type + 0x40) + 0x1c + lVar6 * 0x30);
        lVar8 = lVar8 + 1) {
      this = *(FieldDescriptor **)
              (*(long *)(*(long *)(type + 0x40) + lVar6 * 0x30 + 0x20) + lVar8 * 8);
      pcVar3 = FieldDescriptor::index(this,(char *)__s,__c);
      uVar7 = (ulong)offsets[(int)pcVar3];
      CVar1 = FieldDescriptor::cpp_type(this);
      __c = extraout_EDX;
      switch(CVar1) {
      case CPPTYPE_INT32:
      case CPPTYPE_UINT32:
        uVar2 = *(undefined4 *)(this + 0xa0);
        goto LAB_0030f717;
      case CPPTYPE_INT64:
      case CPPTYPE_UINT64:
        uVar5 = *(undefined8 *)(this + 0xa0);
        goto LAB_0030f75b;
      case CPPTYPE_DOUBLE:
        *(undefined8 *)((long)default_oneof_or_weak_instance + uVar7) = *(undefined8 *)(this + 0xa0)
        ;
        break;
      case CPPTYPE_FLOAT:
        *(undefined4 *)((long)default_oneof_or_weak_instance + uVar7) = *(undefined4 *)(this + 0xa0)
        ;
        break;
      case CPPTYPE_BOOL:
        *(FieldDescriptor *)((long)default_oneof_or_weak_instance + uVar7) = this[0xa0];
        break;
      case CPPTYPE_ENUM:
        pEVar4 = FieldDescriptor::default_value_enum(this);
        uVar2 = *(undefined4 *)(pEVar4 + 0x10);
        __c = extraout_EDX_00;
LAB_0030f717:
        *(undefined4 *)((long)default_oneof_or_weak_instance + uVar7) = uVar2;
        break;
      case CPPTYPE_STRING:
        *(undefined8 *)((long)default_oneof_or_weak_instance + uVar7) = 0;
        uVar5 = *(undefined8 *)(this + 0xa0);
LAB_0030f75b:
        *(undefined8 *)((long)default_oneof_or_weak_instance + uVar7) = uVar5;
        break;
      case CPPTYPE_MESSAGE:
        *(undefined8 *)((long)default_oneof_or_weak_instance + uVar7) = 0;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void DynamicMessageFactory::ConstructDefaultOneofInstance(
    const Descriptor* type,
    const uint32 offsets[],
    void* default_oneof_or_weak_instance) {
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->oneof_decl(i)->field(j);
      void* field_ptr = reinterpret_cast<uint8*>(
          default_oneof_or_weak_instance) + offsets[field->index()];
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                                      \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                        \
          new(field_ptr) TYPE(field->default_value_##TYPE());           \
          break;

        HANDLE_TYPE(INT32 , int32 );
        HANDLE_TYPE(INT64 , int64 );
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT , float );
        HANDLE_TYPE(BOOL  , bool  );
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          new(field_ptr) int(field->default_value_enum()->number());
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:
            case FieldOptions::STRING:
              ArenaStringPtr* asp = new (field_ptr) ArenaStringPtr();
              asp->UnsafeSetDefault(&field->default_value_string());
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE: {
          new(field_ptr) Message*(NULL);
          break;
        }
      }
    }
  }
}